

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::to_string<bool,bool>(lest *this,bool *lhs,string *op,bool *rhs)

{
  ostream *poVar1;
  lest local_1f0 [48];
  lest local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream os;
  bool *rhs_local;
  string *op_local;
  bool *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string_abi_cxx11_(local_1c0,(bool)(*lhs & 1));
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)op);
  poVar1 = std::operator<<(poVar1," ");
  to_string_abi_cxx11_(local_1f0,(bool)(*rhs & 1));
  std::operator<<(poVar1,(string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return this;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}